

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O0

UnknownFieldSet * __thiscall bloaty::Options::mutable_unknown_fields(Options *this)

{
  long in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *unaff_retaddr;
  undefined8 local_18;
  
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1) {
    local_18 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)(in_RDI + 8));
  }
  else {
    local_18 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow(unaff_retaddr);
  }
  return &local_18->unknown_fields;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::UnknownFieldSet* mutable_unknown_fields() {
    return _internal_metadata_.mutable_unknown_fields();
  }